

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb_idict_init(stb_idict *h,int count)

{
  undefined1 auVar1 [16];
  stb__stb_idict__hashpair *psVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int iVar7;
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  long lVar9;
  
  uVar5 = 4;
  if (4 < count) {
    uVar5 = (ulong)(uint)count;
  }
  iVar4 = (int)uVar5;
  h->limit = iVar4;
  iVar12 = 0;
  h->count = 0;
  h->mask = iVar4 - 1;
  h->deleted = 0;
  h->has_del = '\0';
  h->alloced = '\0';
  h->has_empty = '\0';
  iVar7 = (int)((double)iVar4 * 0.3777777883741591);
  if (count < 0x41) {
    iVar7 = iVar12;
  }
  h->shrink_threshhold = iVar7;
  h->delete_threshhold = (int)((float)iVar4 * 0.14999998 * 0.5);
  h->grow_threshhold = (int)((float)iVar4 * 0.85);
  psVar2 = (stb__stb_idict__hashpair *)malloc(uVar5 * 8);
  h->table = psVar2;
  auVar1 = _DAT_0016b030;
  if (psVar2 != (stb__stb_idict__hashpair *)0x0) {
    lVar9 = uVar5 - 1;
    auVar6._8_4_ = (int)lVar9;
    auVar6._0_8_ = lVar9;
    auVar6._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar3 = 0;
    auVar6 = auVar6 ^ _DAT_0016b030;
    auVar8 = _DAT_001bb890;
    auVar10 = _DAT_001bb8a0;
    do {
      auVar11 = auVar10 ^ auVar1;
      iVar7 = auVar6._4_4_;
      if ((bool)(~(auVar11._4_4_ == iVar7 && auVar6._0_4_ < auVar11._0_4_ || iVar7 < auVar11._4_4_)
                & 1)) {
        *(undefined4 *)((long)&psVar2->k + uVar3) = 1;
      }
      if ((auVar11._12_4_ != auVar6._12_4_ || auVar11._8_4_ <= auVar6._8_4_) &&
          auVar11._12_4_ <= auVar6._12_4_) {
        *(undefined4 *)((long)&psVar2[1].k + uVar3) = 1;
      }
      auVar11 = auVar8 ^ auVar1;
      iVar12 = auVar11._4_4_;
      if (iVar12 <= iVar7 && (iVar12 != iVar7 || auVar11._0_4_ <= auVar6._0_4_)) {
        *(undefined4 *)((long)&psVar2[2].k + uVar3) = 1;
        *(undefined4 *)((long)&psVar2[3].k + uVar3) = 1;
      }
      lVar9 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 4;
      auVar10._8_8_ = lVar9 + 4;
      lVar9 = auVar8._8_8_;
      auVar8._0_8_ = auVar8._0_8_ + 4;
      auVar8._8_8_ = lVar9 + 4;
      uVar3 = uVar3 + 0x20;
    } while ((uVar5 * 8 + 0x18 & 0xffffffffffffffe0) != uVar3);
    iVar12 = 1;
  }
  return iVar12;
}

Assistant:

stb_define_hash_base(STB_noprefix, stb_idict, short type; short gc; STB_nofields, stb_idict_,stb_idict_,0.85f,
              stb_int32,STB_IEMPTY,STB_IDEL,STB_nocopy,STB_nodelete,STB_nosafe,
              STB_equal,STB_equal,
              return stb_rehash_improved(k);,stb_int32,STB_nonullvalue,0)

stb_idict * stb_idict_new_size(int size)
{
   stb_idict *e = (stb_idict *) malloc(sizeof(*e));
   if (e) {
      if (!stb_is_pow2(size))
         size = 1 << stb_log2_ceil(size);
      stb_idict_init(e, size);
      e->alloced = 1;
   }
   return e;
}